

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmGetDefinition(void *arg,char *def)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  void *local_20;
  cmMakefile *mf;
  char *def_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)def;
  def_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,def,&local_41);
  pcVar1 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return pcVar1;
}

Assistant:

const char* CCONV cmGetDefinition(void* arg, const char* def)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return mf->GetDefinition(def);
}